

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_unpack.h
# Opt level: O2

void serialization::
     serialize_unpack<char_const*const*,serialization::json_oarchive,std::vector<Person,std::allocator<Person>>const&,std::optional<std::__cxx11::string>const&,std::map<std::__cxx11::string,Person,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>const&,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>const&>
               (char ***arg,json_oarchive *ar,vector<Person,_std::allocator<Person>_> *front,
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *next,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
                     *next_1,
               vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               *next_2)

{
  json_oarchive::save_key_start(ar,**arg);
  serialize_container_helper<serialization::json_oarchive,std::vector<Person,std::allocator<Person>>>
            (ar,front);
  *arg = *arg + 1;
  serialize_unpack<char_const*const*&,serialization::json_oarchive,std::__cxx11::string,std::map<std::__cxx11::string,Person,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>const&,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>const&>
            (arg,ar,next,next_1,next_2);
  return;
}

Assistant:

inline void serialize_unpack(Argument && arg, Archive & ar, T && front, Args && ... next)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto key = *arg;
    ar.save_key_start(key);
    serialize_helper(ar, front);
    ar.save_key_end(key);

    serialize_unpack(++arg, ar, std::forward<Args>(next)...);
}